

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O2

void test_dict_remove(void)

{
  int iVar1;
  VALUE *pVVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  VALUE d;
  char key [32];
  
  value_init_dict(&d);
  for (uVar4 = 0; uVar4 != 100000; uVar4 = uVar4 + 1) {
    sprintf(key,"%d",(ulong)uVar4);
    pVVar2 = value_dict_get_or_add(&d,key);
    acutest_check_((uint)(pVVar2 != (VALUE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x363,"%s","v != NULL");
    value_init_int32(pVVar2,uVar4);
  }
  iVar1 = value_dict_verify(&d);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x366,"%s","value_dict_verify(&d) == 0");
  for (uVar4 = 0; uVar4 != 0x186ab; uVar4 = uVar4 + 0x11) {
    sprintf(key,"%d",(ulong)uVar4);
    iVar1 = value_dict_remove(&d,key);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,0x36a,"%s","value_dict_remove(&d, key) == 0");
  }
  iVar1 = value_dict_remove(&d,"n/a");
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36d,"%s","value_dict_remove(&d, \"n/a\") != 0");
  sVar3 = value_dict_size(&d);
  acutest_check_((uint)(sVar3 == 0x16fa5),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x36f,"%s","value_dict_size(&d) == N - n_removed");
  for (uVar4 = 0; uVar4 != 100000; uVar4 = uVar4 + 1) {
    sprintf(key,"%d",(ulong)uVar4);
    pVVar2 = value_dict_get(&d,key);
    if ((uVar4 / 0x11) * 0x11 == uVar4) {
      bVar6 = pVVar2 == (VALUE *)0x0;
      iVar1 = 0x375;
      pcVar5 = "v == NULL";
    }
    else {
      bVar6 = pVVar2 != (VALUE *)0x0;
      iVar1 = 0x377;
      pcVar5 = "v != NULL";
    }
    acutest_check_((uint)bVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                   ,iVar1,"%s",pcVar5);
  }
  value_dict_clean(&d);
  sVar3 = value_dict_size(&d);
  acutest_check_((uint)(sVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x37b,"%s","value_dict_size(&d) == 0");
  value_fini(&d);
  return;
}

Assistant:

static void
test_dict_remove(void)
{
    const int N = 100000;

    VALUE d;
    VALUE* v;
    int i;
    int n_removed = 0;
    char key[32];

    value_init_dict(&d);
    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get_or_add(&d, key);
        TEST_CHECK(v != NULL);
        value_init_int32(v, i);
    }
    TEST_CHECK(value_dict_verify(&d) == 0);

    for(i = 0; i < N; i += 17) {
        sprintf(key, "%d", i);
        TEST_CHECK(value_dict_remove(&d, key) == 0);
        n_removed++;
    }
    TEST_CHECK(value_dict_remove(&d, "n/a") != 0);

    TEST_CHECK(value_dict_size(&d) == N - n_removed);

    for(i = 0; i < N; i++) {
        sprintf(key, "%d", i);
        v = value_dict_get(&d, key);
        if(i % 17 == 0)
            TEST_CHECK(v == NULL);
        else
            TEST_CHECK(v != NULL);
    }

    value_dict_clean(&d);
    TEST_CHECK(value_dict_size(&d) == 0);
    value_fini(&d);
}